

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

bool __thiscall dynet::LookupParameter::is_updated(LookupParameter *this)

{
  Model *pMVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var2
  ;
  
  pMVar1 = this->mp;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    ((pMVar1->updated_lookup_params).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (pMVar1->updated_lookup_params).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&this->index);
  return _Var2._M_current !=
         (pMVar1->updated_lookup_params).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

bool LookupParameter::is_updated() {
  return mp->is_updated_lookup_param(this);
}